

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestTest.cpp
# Opt level: O2

void __thiscall
ManifestTest_normalize_path_randomized_Test::TestBody
          (ManifestTest_normalize_path_randomized_Test *this)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *component;
  long lVar5;
  const_iterator __position;
  const_iterator __position_00;
  pointer pbVar6;
  char *message;
  bool bVar7;
  StringRef SVar8;
  allocator local_1da;
  allocator local_1d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  int local_1bc;
  string path_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathComponents;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  componentVariants;
  type componentIndexDice;
  type lengthDice;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string path;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50;
  
  std::__cxx11::string::string((string *)&path,"",(allocator *)&local_110);
  std::__cxx11::string::string(local_d0,".",(allocator *)&path_1);
  std::__cxx11::string::string(local_b0,"..",(allocator *)&pathComponents);
  std::__cxx11::string::string(local_90,"a",(allocator *)&lengthDice);
  std::__cxx11::string::string(local_70,"b",(allocator *)&componentIndexDice);
  componentVariants.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  componentVariants.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  componentVariants.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_initialize<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&componentVariants
             ,&path,&local_50);
  lVar5 = 0x80;
  do {
    std::__cxx11::string::_M_dispose();
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lengthDice._M_f._M_param._M_a = 1;
  lengthDice._M_f._M_param._M_b = 5;
  lengthDice._M_bound_args.
  super__Tuple_impl<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>_>
  .
  super__Head_base<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_false>
  ._M_head_impl._M_x =
       (_Tuple_impl<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>_>
        )(_Head_base<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_false>
          )0x1;
  componentIndexDice._M_f._M_param =
       (param_type)
       (((long)componentVariants.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)componentVariants.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffe0U) * 0x8000000 +
       -0x100000000);
  componentIndexDice._M_bound_args.
  super__Tuple_impl<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>_>
  .
  super__Head_base<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_false>
  ._M_head_impl._M_x =
       (_Tuple_impl<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>_>
        )(_Head_base<0UL,_std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_false>
          )0x1;
  iVar3 = 1;
LAB_0011dc5b:
  if (iVar3 == 1000) {
    path._M_dataplus._M_p._0_1_ = 1;
    path._M_string_length = 0;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&path._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&componentVariants);
    return;
  }
  pathComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pathComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pathComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1bc = iVar3;
  iVar3 = std::
          _Bind<std::uniform_int_distribution<int>(std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>)>
          ::operator()(&lengthDice);
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  while (pbVar1 = pathComponents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, bVar7 = iVar3 != 0, iVar3 = iVar3 + -1
        , bVar7) {
    iVar4 = std::
            _Bind<std::uniform_int_distribution<int>(std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>)>
            ::operator()(&componentIndexDice);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pathComponents,
                componentVariants.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar4);
  }
  path._M_dataplus._M_p._0_1_ = SUB81(&path.field_2,0);
  path._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&path.field_2 >> 8);
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  for (pbVar6 = pathComponents.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    std::operator+(&local_110,"/",pbVar6);
    std::__cxx11::string::append((string *)&path);
    std::__cxx11::string::_M_dispose();
  }
  SVar8.Data._1_7_ = path._M_dataplus._M_p._1_7_;
  SVar8.Data._0_1_ = path._M_dataplus._M_p._0_1_;
  SVar8.Length = path._M_string_length;
  SVar8 = llvm::sys::path::root_name(SVar8,native);
  if (SVar8.Length == 0) {
    std::__cxx11::string::string((string *)&local_130,"/",&local_1da);
    std::__cxx11::string::string((string *)&local_50,(string *)&path);
    normalize(&local_110,&local_130,&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1d8,&pathComponents);
    bVar7 = true;
    __position._M_current =
         local_1d8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if ((local_1d8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         local_1d8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start) &&
       (bVar2 = std::operator!=(local_1d8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1,"a"),
       __position._M_current =
            local_1d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start, bVar2)) {
      bVar7 = std::operator!=(local_1d8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1,"b");
      bVar7 = !bVar7;
      __position._M_current =
           local_1d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
LAB_0011ddc3:
    do {
      if (__position._M_current ==
          local_1d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0011de36;
      bVar2 = std::operator==(__position._M_current,"");
      __position_00._M_current = __position._M_current;
      if ((!bVar2) && (bVar2 = std::operator==(__position._M_current,"."), !bVar2)) {
        bVar2 = std::operator==(__position._M_current,"..");
        if (!bVar2) {
          __position._M_current = __position._M_current + 1;
          goto LAB_0011ddc3;
        }
        if (__position._M_current !=
            local_1d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          __position_00._M_current = __position._M_current + -1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&local_1d8,__position);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&local_1d8,__position_00);
      __position._M_current =
           local_1d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    } while( true );
  }
  goto LAB_0011df6a;
LAB_0011de36:
  std::__cxx11::string::string((string *)&path_1,"/",&local_1d9);
  pbVar1 = local_1d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    if (path_1._M_dataplus._M_p[path_1._M_string_length - 1] != '/') {
      std::__cxx11::string::append((char *)&path_1);
    }
    std::__cxx11::string::append((string *)&path_1);
  }
  if (!bVar7 && path_1._M_dataplus._M_p[path_1._M_string_length - 1] != '/') {
    std::__cxx11::string::append((char *)&path_1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"normalize(\"/\", path)","normalize_path_model(pathComponents)",
             &local_110,&path_1);
  std::__cxx11::string::_M_dispose();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_110);
    message = "";
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&path_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
               ,0xde,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&path_1,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&path_1);
    if ((long *)local_110._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_110._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
LAB_0011df6a:
  std::__cxx11::string::_M_dispose();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pathComponents);
  iVar3 = local_1bc + 1;
  goto LAB_0011dc5b;
}

Assistant:

TEST(ManifestTest, normalize_path_randomized) {
  const std::vector<std::string> componentVariants = { "", ".", "..", "a", "b" };

  std::default_random_engine generator;
  std::uniform_int_distribution<int> lengthDistribution(1, 5);
  std::uniform_int_distribution<int> componentDistribution(0, componentVariants.size() - 1);

  auto lengthDice = std::bind(lengthDistribution, generator);
  auto componentIndexDice = std::bind(componentDistribution, generator);

  bool atLeastOneTested = true;

  for (int n = 1; n < 1000; n++) {
    std::vector<std::string> pathComponents;
    const int length = lengthDice();

    for (int i = 0; i < length; i++) {
      pathComponents.push_back(componentVariants[componentIndexDice()]);
    }


    std::string path;
    for (auto &component : pathComponents) {
        path += "/" + component;
    }

    // Ignore path names with "network" prefixes, such as "//net".
    if (llvm::sys::path::root_name(path).size() != 0) {
      continue;
    } else {
      // Make sure we didn't ignore all test paths.
      atLeastOneTested = true;
    }

    EXPECT_EQ(normalize("/", path), normalize_path_model(pathComponents));
  }

  ASSERT_TRUE(atLeastOneTested);
}